

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

int ParseFlagExpressionString(FScanner *sc,FParseValue *vals)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint local_28;
  int style;
  bool gotparen;
  FParseValue *vals_local;
  FScanner *sc_local;
  
  bVar1 = FScanner::CheckNumber(sc);
  if (bVar1) {
    FScanner::MustGetNumber(sc);
    sc_local._4_4_ = sc->Number;
  }
  else {
    bVar1 = FScanner::CheckString(sc,"(");
    local_28 = 0;
    do {
      FScanner::MustGetString(sc);
      iVar3 = FScanner::MustMatchString(sc,&vals->Name,0x10);
      local_28 = vals[iVar3].Flag | local_28;
      bVar2 = FScanner::CheckString(sc,"|");
    } while (bVar2);
    sc_local._4_4_ = local_28;
    if (bVar1) {
      FScanner::MustGetStringName(sc,")");
    }
  }
  return sc_local._4_4_;
}

Assistant:

int ParseFlagExpressionString(FScanner &sc, const FParseValue *vals)
{
	// May be given flags by number...
	if (sc.CheckNumber())
	{
		sc.MustGetNumber();
		return sc.Number;
	}

	// ... else should be flags by name.
	// NOTE: Later this should be removed and a normal expression used.
	// The current DECORATE parser can't handle this though.
	bool gotparen = sc.CheckString("(");
	int style = 0;
	do
	{
		sc.MustGetString();
		style |= vals[sc.MustMatchString(&vals->Name, sizeof (*vals))].Flag;
	}
	while (sc.CheckString("|"));
	if (gotparen)
	{
		sc.MustGetStringName(")");
	}

	return style;
}